

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O1

int bssl::tls_dispatch_alert(SSL *ssl)

{
  undefined1 *puVar1;
  ushort uVar2;
  int iVar3;
  SSL_PROTOCOL_METHOD *in_RAX;
  size_t in_R9;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  size_t bytes_written;
  SSL_PROTOCOL_METHOD *local_18;
  
  local_18 = in_RAX;
  iVar3 = SSL_is_quic(ssl);
  if (iVar3 == 0) {
    in.size_ = in_R9;
    in.data_ = (uchar *)0x2;
    iVar3 = do_tls_write((bssl *)ssl,(SSL *)&stack0xffffffffffffffe8,(size_t *)0x15,
                         (char)ssl->s3 + 0xfd,in);
    if ((0 < iVar3) && (local_18 != (SSL_PROTOCOL_METHOD *)0x2)) {
      __assert_fail("bytes_written == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                    ,0x179,"int bssl::tls_dispatch_alert(SSL *)");
    }
    if (iVar3 < 1) {
      return iVar3;
    }
  }
  else {
    iVar3 = (*ssl->quic_method->send_alert)(ssl,ssl->s3->quic_write_level,ssl->s3->send_alert[1]);
    if (iVar3 == 0) {
      ERR_put_error(0x10,0,0x12a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                    ,0x16f);
      return 0;
    }
  }
  puVar1 = &ssl->s3->field_0xdc;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfbff;
  if (ssl->s3->send_alert[0] == '\x02') {
    BIO_flush((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
  }
  in_00.size_ = in_R9;
  in_00.data_ = (uchar *)0x2;
  ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x15,(int)ssl->s3 + 0x1fd,in_00);
  uVar2 = *(ushort *)ssl->s3->send_alert;
  ssl_do_info_callback(ssl,0x4008,(uint)(ushort)(uVar2 << 8 | uVar2 >> 8));
  return 1;
}

Assistant:

int tls_dispatch_alert(SSL *ssl) {
  if (SSL_is_quic(ssl)) {
    if (!ssl->quic_method->send_alert(ssl, ssl->s3->quic_write_level,
                                      ssl->s3->send_alert[1])) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_QUIC_INTERNAL_ERROR);
      return 0;
    }
  } else {
    size_t bytes_written;
    int ret =
        do_tls_write(ssl, &bytes_written, SSL3_RT_ALERT, ssl->s3->send_alert);
    if (ret <= 0) {
      return ret;
    }
    assert(bytes_written == 2);
  }

  ssl->s3->alert_dispatch = false;

  // If the alert is fatal, flush the BIO now.
  if (ssl->s3->send_alert[0] == SSL3_AL_FATAL) {
    BIO_flush(ssl->wbio.get());
  }

  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_ALERT, ssl->s3->send_alert);

  int alert = (ssl->s3->send_alert[0] << 8) | ssl->s3->send_alert[1];
  ssl_do_info_callback(ssl, SSL_CB_WRITE_ALERT, alert);

  return 1;
}